

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

int __thiscall cmProcess::ReportStatus(cmProcess *this)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  int local_14;
  int result;
  cmProcess *this_local;
  
  local_14 = 1;
  iVar1 = cmsysProcess_GetState(this->Process);
  switch(iVar1) {
  case 0:
    poVar3 = std::operator<<((ostream *)&std::cerr,"cmProcess: Never started ");
    poVar3 = std::operator<<(poVar3,(string *)&this->Command);
    std::operator<<(poVar3," process.\n");
    break;
  case 1:
    poVar3 = std::operator<<((ostream *)&std::cerr,"cmProcess: Error executing ");
    poVar3 = std::operator<<(poVar3,(string *)&this->Command);
    poVar3 = std::operator<<(poVar3," process: ");
    pcVar2 = cmsysProcess_GetErrorString(this->Process);
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::operator<<(poVar3,"\n");
    break;
  case 2:
    poVar3 = std::operator<<((ostream *)&std::cerr,"cmProcess: ");
    poVar3 = std::operator<<(poVar3,(string *)&this->Command);
    std::operator<<(poVar3," process exited with an exception: ");
    iVar1 = cmsysProcess_GetExitException(this->Process);
    switch(iVar1) {
    case 0:
      std::operator<<((ostream *)&std::cerr,"None");
      break;
    case 1:
      std::operator<<((ostream *)&std::cerr,"Segmentation fault");
      break;
    case 2:
      std::operator<<((ostream *)&std::cerr,"Illegal instruction");
      break;
    case 3:
      std::operator<<((ostream *)&std::cerr,"Interrupted by user");
      break;
    case 4:
      std::operator<<((ostream *)&std::cerr,"Numerical exception");
      break;
    case 5:
      std::operator<<((ostream *)&std::cerr,"Unknown");
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    break;
  case 3:
    poVar3 = std::operator<<((ostream *)&std::cerr,"cmProcess: Never terminated ");
    poVar3 = std::operator<<(poVar3,(string *)&this->Command);
    std::operator<<(poVar3," process.\n");
    break;
  case 4:
    local_14 = cmsysProcess_GetExitValue(this->Process);
    poVar3 = std::operator<<((ostream *)&std::cerr,"cmProcess: ");
    poVar3 = std::operator<<(poVar3,(string *)&this->Command);
    poVar3 = std::operator<<(poVar3," process exited with code ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
    std::operator<<(poVar3,"\n");
    break;
  case 5:
    poVar3 = std::operator<<((ostream *)&std::cerr,"cmProcess: killed ");
    poVar3 = std::operator<<(poVar3,(string *)&this->Command);
    std::operator<<(poVar3," process due to timeout.\n");
    break;
  case 6:
    poVar3 = std::operator<<((ostream *)&std::cerr,"cmProcess: killed ");
    poVar3 = std::operator<<(poVar3,(string *)&this->Command);
    std::operator<<(poVar3," process.\n");
  }
  return local_14;
}

Assistant:

int cmProcess::ReportStatus()
{
  int result = 1;
  switch(cmsysProcess_GetState(this->Process))
    {
    case cmsysProcess_State_Starting:
      {
      std::cerr << "cmProcess: Never started "
           << this->Command << " process.\n";
      } break;
    case cmsysProcess_State_Error:
      {
      std::cerr << "cmProcess: Error executing " << this->Command
                << " process: "
                << cmsysProcess_GetErrorString(this->Process)
                << "\n";
      } break;
    case cmsysProcess_State_Exception:
      {
      std::cerr << "cmProcess: " << this->Command
                      << " process exited with an exception: ";
      switch(cmsysProcess_GetExitException(this->Process))
        {
        case cmsysProcess_Exception_None:
          {
          std::cerr << "None";
          } break;
        case cmsysProcess_Exception_Fault:
          {
          std::cerr << "Segmentation fault";
          } break;
        case cmsysProcess_Exception_Illegal:
          {
          std::cerr << "Illegal instruction";
          } break;
        case cmsysProcess_Exception_Interrupt:
          {
          std::cerr << "Interrupted by user";
          } break;
        case cmsysProcess_Exception_Numerical:
          {
          std::cerr << "Numerical exception";
          } break;
        case cmsysProcess_Exception_Other:
          {
          std::cerr << "Unknown";
          } break;
        }
      std::cerr << "\n";
      } break;
    case cmsysProcess_State_Executing:
      {
      std::cerr << "cmProcess: Never terminated " <<
        this->Command << " process.\n";
      } break;
    case cmsysProcess_State_Exited:
      {
      result = cmsysProcess_GetExitValue(this->Process);
      std::cerr << "cmProcess: " << this->Command
                << " process exited with code "
                << result << "\n";
      } break;
    case cmsysProcess_State_Expired:
      {
      std::cerr << "cmProcess: killed " << this->Command
                << " process due to timeout.\n";
      } break;
    case cmsysProcess_State_Killed:
      {
      std::cerr << "cmProcess: killed " << this->Command << " process.\n";
      } break;
    }
  return result;

}